

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O3

char * chest_trap_name(object *obj)

{
  char *pcVar1;
  uint uVar2;
  chest_trap *pcVar3;
  chest_trap *pcVar4;
  bool bVar5;
  
  uVar2 = (uint)(ushort)obj->pval;
  if (obj->pval < 0) {
    pcVar1 = "disarmed";
    if (uVar2 == 0xffff) {
      pcVar1 = "unlocked";
    }
  }
  else {
    pcVar1 = "empty";
    if (chest_traps != (chest_trap *)0x0 && uVar2 != 0) {
      pcVar4 = (chest_trap *)0x0;
      pcVar3 = chest_traps;
      do {
        if (((pcVar3->pval & uVar2) != 0) &&
           (bVar5 = pcVar4 != (chest_trap *)0x0, pcVar4 = pcVar3, bVar5)) {
          return "multiple traps";
        }
        pcVar3 = pcVar3->next;
      } while (pcVar3 != (chest_trap *)0x0);
      if (pcVar4 != (chest_trap *)0x0) {
        return pcVar4->name;
      }
    }
  }
  return pcVar1;
}

Assistant:

const char *chest_trap_name(const struct object *obj)
{
	int16_t trap_value = obj->pval;

	/* Non-zero value means there either were or are still traps */
	if (trap_value < 0) {
		return (trap_value == -1) ? "unlocked" : "disarmed";
	} else if (trap_value > 0) {
		struct chest_trap *trap = chest_traps, *found = NULL;
		while (trap) {
			if (trap_value & trap->pval) {
				if (found) {
					return "multiple traps";
				}
				found = trap;
			}
			trap = trap->next;
		}
		if (found) {
			return found->name;
		}
	}

	return "empty";
}